

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessStopJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *param_2)

{
  element_type *peVar1;
  Error local_50;
  Expression *local_28;
  Expression *param_2_local;
  CommissionerAppPtr *aCommissioner_local;
  Interpreter *this_local;
  
  local_28 = param_2;
  param_2_local = (Expression *)aCommissioner;
  aCommissioner_local = (CommissionerAppPtr *)this;
  this_local = (Interpreter *)__return_storage_ptr__;
  peVar1 = std::
           __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)aCommissioner);
  (*(peVar1->super_CommissionerHandler)._vptr_CommissionerHandler[0xd])();
  Error::Error(&local_50);
  Value::Value(__return_storage_ptr__,&local_50);
  Error::~Error(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessStopJob(CommissionerAppPtr &aCommissioner, const Expression &)
{
    aCommissioner->Stop();
    return ERROR_NONE;
}